

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O1

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  byte *pbVar1;
  _Rb_tree_header *p_Var2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Base_ptr __n;
  Message MVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar8;
  const_iterator cVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX;
  _Base_ptr p_Var11;
  size_t sVar12;
  string *name;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar14;
  undefined1 __k [8];
  char *__s;
  ostream *poVar15;
  string local_e8;
  char *local_c8;
  internal *local_c0;
  undefined1 auStack_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  undefined1 local_98 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Message errors;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  *this = (TypedTestCasePState)0x1;
  auStack_b8 = (undefined1  [8])0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  name_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = registered_tests + -1;
  local_c8 = registered_tests;
  local_c0 = (internal *)file;
  tests._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = line;
  do {
    pbVar1 = (byte *)(__s + 1);
    __s = __s + 1;
    iVar5 = isspace((uint)*pbVar1);
  } while (iVar5 != 0);
  p_Var2 = &tests._M_t._M_impl.super__Rb_tree_header;
  do {
    pcVar7 = strchr(__s,0x2c);
    errors.ss_.ptr_ =
         (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )&local_40;
    if (pcVar7 == (char *)0x0) {
      sVar12 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&errors,__s,__s + sVar12);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&errors,__s,pcVar7);
    }
    sVar8 = errors.ss_.ptr_;
    if (local_48 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pbVar13 = local_48 + (long)errors.ss_.ptr_;
      do {
        MVar4.ss_.ptr_ = errors.ss_.ptr_;
        iVar5 = isspace((uint)(byte)pbVar13[-1]);
        sVar8 = MVar4.ss_.ptr_;
        if (iVar5 == 0) break;
        sVar14.ptr_ = pbVar13 + -1;
        if ((local_48 != sVar14.ptr_ + (1 - (long)MVar4.ss_.ptr_)) &&
           (sVar12 = (long)local_48 - (long)(sVar14.ptr_ + (1 - (long)MVar4.ss_.ptr_)), sVar12 != 0)
           ) {
          pbVar13 = sVar14.ptr_ + ((long)errors.ss_.ptr_ - (long)MVar4.ss_.ptr_);
          if (sVar12 == 1) {
            *pbVar13 = pbVar13[1];
          }
          else {
            memmove(pbVar13,sVar14.ptr_ + ((long)errors.ss_.ptr_ - (long)MVar4.ss_.ptr_) + 1,sVar12)
            ;
          }
        }
        pbVar3 = local_48 + -1;
        local_48[(long)errors.ss_.ptr_ + -1] =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x0;
        pbVar13 = sVar14.ptr_ + ((long)errors.ss_.ptr_ - (long)MVar4.ss_.ptr_);
        sVar8 = errors.ss_.ptr_;
        local_48 = pbVar3;
      } while ((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )sVar14.ptr_ != MVar4.ss_.ptr_);
    }
    errors.ss_.ptr_ =
         (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )&local_40;
    local_98 = (undefined1  [8])sVar8.ptr_;
    if ((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
         )sVar8.ptr_ == errors.ss_.ptr_) {
      tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_40._8_8_;
      local_98 = (undefined1  [8])p_Var2;
    }
    tests._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = local_40._M_allocated_capacity._1_7_;
    tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = local_40._M_local_buf[0];
    tests._M_t._M_impl._0_8_ = local_48;
    local_48 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40._M_local_buf[0] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    if (local_98 != (undefined1  [8])p_Var2) {
      operator_delete((void *)local_98,tests._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1)
      ;
    }
    if (errors.ss_.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40) {
      operator_delete((void *)errors.ss_.ptr_,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    __s = strchr(__s,0x2c);
    if (__s == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(__s + 1);
        __s = __s + 1;
        iVar5 = isspace((uint)*pbVar1);
      } while (iVar5 != 0);
    }
  } while (__s != (char *)0x0);
  Message::Message((Message *)&local_58);
  p_Var11 = (_Base_ptr)&tests;
  tests._M_t._M_impl._0_8_ = tests._M_t._M_impl._0_8_ & 0xffffffff00000000;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var11;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var11;
  if (auStack_b8 !=
      (undefined1  [8])
      name_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar15 = (ostream *)(local_58.ptr_ + 0x10);
    __k = auStack_b8;
    do {
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98,(key_type *)__k);
      p_Var11 = (_Base_ptr)&tests;
      if (cVar9._M_node == p_Var11) {
        p_Var10 = *(_Rb_tree_node_base **)(this + 0x20);
        if (p_Var10 != (_Rb_tree_node_base *)(this + 0x10)) {
          __n = (_Base_ptr)((key_type *)__k)->_M_string_length;
          do {
            if ((__n == p_Var10[1]._M_parent) &&
               ((__n == (_Base_ptr)0x0 ||
                (iVar5 = bcmp((((key_type *)__k)->_M_dataplus)._M_p,*(void **)(p_Var10 + 1),
                              (size_t)__n), iVar5 == 0)))) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
              goto LAB_00a57ebe;
            }
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          } while (p_Var10 != (_Rb_tree_node_base *)(this + 0x10));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"No test named ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,(((key_type *)__k)->_M_dataplus)._M_p,((key_type *)__k)->_M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15," can be found in this test case.\n",0x21);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Test ",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,(((key_type *)__k)->_M_dataplus)._M_p,((key_type *)__k)->_M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15," is listed more than once.\n",0x1b);
      }
LAB_00a57ebe:
      __k = (undefined1  [8])((long)__k + 0x20);
    } while (__k != (undefined1  [8])
                    name_vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar5 = (int)p_Var11;
  p_Var10 = *(_Rb_tree_node_base **)(this + 0x20);
  if (p_Var10 != (_Rb_tree_node_base *)(this + 0x10)) {
    do {
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98,(key_type *)(p_Var10 + 1));
      p_Var11 = (_Base_ptr)&tests;
      if (cVar9._M_node == p_Var11) {
        poVar15 = (ostream *)(local_58.ptr_ + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,"You forgot to list test ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar15,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
      }
      iVar5 = (int)p_Var11;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != (_Rb_tree_node_base *)(this + 0x10));
  }
  sVar8.ptr_ = local_58.ptr_;
  StringStreamToString((string *)&errors,local_58.ptr_);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errors,""
                    );
  if (iVar6 != 0) {
    FormatFileLocation_abi_cxx11_
              (&local_e8,local_c0,
               (char *)(ulong)tests._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,iVar5);
    VerifyRegisteredTestNames();
    if (errors.ss_.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40) {
      operator_delete((void *)errors.ss_.ptr_,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    if (local_58.ptr_ != (stringstream *)0x0) {
      (**(code **)(*(long *)local_58.ptr_ + 8))();
      local_58.ptr_ = (stringstream *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_b8);
    _Unwind_Resume(extraout_RAX);
  }
  if (errors.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40) {
    operator_delete((void *)errors.ss_.ptr_,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_98);
  if (sVar8.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)sVar8.ptr_ + 8))(sVar8.ptr_);
    local_58.ptr_ = (stringstream *)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_b8);
  return local_c8;
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}